

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModelBullet.cpp
# Opt level: O1

int __thiscall chrono::collision::ChCollisionModelBullet::BuildModel(ChCollisionModelBullet *this)

{
  ChContactable *pCVar1;
  long lVar2;
  long *plVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  char cVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  pCVar1 = (this->super_ChCollisionModel).mcontactable;
  if (pCVar1 != (ChContactable *)0x0) {
    iVar5 = (*pCVar1->_vptr_ChContactable[0xf])();
    if (CONCAT44(extraout_var,iVar5) != 0) {
      iVar5 = (*((this->super_ChCollisionModel).mcontactable)->_vptr_ChContactable[0xf])();
      if (*(long *)(CONCAT44(extraout_var_00,iVar5) + 0x38) != 0) {
        iVar5 = (*((this->super_ChCollisionModel).mcontactable)->_vptr_ChContactable[0xf])();
        cVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar5) + 0x50))
                          ((long *)CONCAT44(extraout_var_01,iVar5));
        if (cVar4 != '\0') {
          iVar5 = (*((this->super_ChCollisionModel).mcontactable)->_vptr_ChContactable[0xf])();
          lVar2 = *(long *)(CONCAT44(extraout_var_02,iVar5) + 0x38);
          plVar3 = *(long **)(lVar2 + 0x248);
          this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar2 + 0x250);
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
          }
          (**(code **)(*plVar3 + 0x20))(plVar3,this);
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
        }
      }
    }
  }
  return 1;
}

Assistant:

int ChCollisionModelBullet::BuildModel() {
    // Insert model into collision system, if applicable.
    if (mcontactable &&                                 //
        mcontactable->GetPhysicsItem() &&               //
        mcontactable->GetPhysicsItem()->GetSystem() &&  //
        mcontactable->GetPhysicsItem()->GetCollide()    //
    )
        mcontactable->GetPhysicsItem()->GetSystem()->GetCollisionSystem()->Add(this);

    return 1;
}